

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.h
# Opt level: O1

bool __thiscall
CCommandBuffer::AddCommand<CCommandBuffer::CTextureCreateCommand>
          (CCommandBuffer *this,CTextureCreateCommand *Command)

{
  uint uVar1;
  uchar *puVar2;
  CCommand *pCVar3;
  CCommand *pCVar4;
  CCommand *pCVar5;
  undefined4 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  CCommand *pCVar11;
  ulong uVar12;
  ulong uVar13;
  
  puVar2 = (this->m_CmdBuffer).m_pData;
  uVar1 = (this->m_CmdBuffer).m_Used;
  uVar12 = (ulong)((int)puVar2 + uVar1 & 7);
  uVar13 = (uVar1 - uVar12) + 0x40;
  if ((this->m_CmdBuffer).m_Size < uVar13) {
    pCVar11 = (CCommand *)0x0;
  }
  else {
    pCVar11 = (CCommand *)(puVar2 + (uVar1 - uVar12) + 8);
    (this->m_CmdBuffer).m_Used = (uint)uVar13;
  }
  if (pCVar11 != (CCommand *)0x0) {
    uVar6 = *(undefined4 *)&(Command->super_CCommand).field_0x4;
    pCVar3 = (Command->super_CCommand).m_pNext;
    iVar9 = Command->m_Slot;
    iVar10 = Command->m_Width;
    pCVar4 = *(CCommand **)&Command->m_Height;
    iVar7 = Command->m_Format;
    iVar8 = Command->m_StoreFormat;
    pCVar5 = *(CCommand **)&Command->m_Flags;
    pCVar11->m_Cmd = (Command->super_CCommand).m_Cmd;
    *(undefined4 *)&pCVar11->field_0x4 = uVar6;
    pCVar11->m_pNext = pCVar3;
    *(void **)(pCVar11 + 3) = Command->m_pData;
    pCVar11[2].m_Cmd = iVar7;
    *(int *)&pCVar11[2].field_0x4 = iVar8;
    pCVar11[2].m_pNext = pCVar5;
    pCVar11[1].m_Cmd = iVar9;
    *(int *)&pCVar11[1].field_0x4 = iVar10;
    pCVar11[1].m_pNext = pCVar4;
    pCVar11->m_pNext = (CCommand *)0x0;
    if (this->m_pCmdBufferTail != (CCommand *)0x0) {
      this->m_pCmdBufferTail->m_pNext = pCVar11;
    }
    if (this->m_pCmdBufferHead == (CCommand *)0x0) {
      this->m_pCmdBufferHead = pCVar11;
    }
    this->m_pCmdBufferTail = pCVar11;
  }
  return pCVar11 != (CCommand *)0x0;
}

Assistant:

void *Alloc(unsigned Requested, unsigned Alignment = 8) // TODO: use alignof(std::max_align_t)
		{
			size_t Offset = Alignment - (reinterpret_cast<uintptr_t>(m_pData + m_Used) % Alignment);
			if(Requested + Offset + m_Used > m_Size)
				return 0;

			void *pPtr = &m_pData[m_Used + Offset];
			m_Used += Requested + Offset;
			return pPtr;
		}